

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sizeclasstable.h
# Opt level: O0

size_t snmalloc::large_size_to_chunk_size(size_t size)

{
  long lVar1;
  ulong in_RDI;
  undefined8 local_10;
  
  local_10 = in_RDI;
  if (2 < in_RDI) {
    lVar1 = 0x3f;
    if (in_RDI - 1 != 0) {
      for (; in_RDI - 1 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    local_10 = bits::one_at_bit<unsigned_long,unsigned_long>(0x40 - (long)(int)((uint)lVar1 ^ 0x3f))
    ;
  }
  return local_10;
}

Assistant:

inline static size_t large_size_to_chunk_size(size_t size)
  {
    return bits::next_pow2(size);
  }